

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

void KEY_OFF(YM2151Operator *op,UINT32 key_clr)

{
  UINT32 key_clr_local;
  YM2151Operator *op_local;
  
  if (((op->key != 0) && (op->key = (key_clr ^ 0xffffffff) & op->key, op->key == 0)) &&
     (1 < op->state)) {
    op->state = 1;
  }
  return;
}

Assistant:

INLINE void KEY_OFF(channel_ *CH, int nsl)
{
  slot_ *SL = &(CH->SLOT[nsl]); // on recupère le bon pointeur de slot

  if (SL->Ecurp != RELEASE)     // la touche est-elle appuyée ?
  {
    if (SL->Ecnt < ENV_DECAY)   // attack phase ?
    {
      SL->Ecnt = (ENV_TAB[SL->Ecnt >> ENV_LBITS] << ENV_LBITS) + ENV_DECAY;
    }

    SL->Einc = SL->EincR;
    SL->Ecmp = ENV_END;
    SL->Ecurp = RELEASE;
  }
}